

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O2

void __thiscall IZDeflate::send_tree(IZDeflate *this,ct_data *tree,int max_code)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int value;
  int iVar10;
  
  uVar1 = (tree->dl).dad;
  uVar8 = (uint)uVar1;
  uVar4 = 7;
  if (uVar1 == 0) {
    uVar4 = 0x8a;
  }
  lVar5 = 0;
  iVar3 = (uVar1 != 0) + 3;
  uVar6 = 0xffffffff;
  do {
    value = -0xb;
    iVar2 = -1;
    do {
      iVar10 = iVar2;
      iVar9 = value;
      uVar7 = uVar8;
      if (max_code < lVar5) {
        return;
      }
      uVar1 = tree[lVar5 + 1].dl.dad;
      uVar8 = (uint)uVar1;
      lVar5 = lVar5 + 1;
      value = iVar9 + 1;
    } while ((iVar9 + 0xc < (int)uVar4) && (iVar2 = iVar10 + -1, uVar7 == uVar8));
    if ((int)(iVar9 + 0xcU) < iVar3) {
      do {
        send_bits(this,(uint)this->bl_tree[uVar7].fc.freq,(uint)this->bl_tree[uVar7].dl.dad);
        iVar10 = iVar10 + 1;
      } while (iVar10 != 0);
    }
    else {
      if (uVar7 == 0) {
        if (iVar9 + 0xbU < 10) {
          send_bits(this,(uint)this->bl_tree[0x11].fc.freq,(uint)this->bl_tree[0x11].dl.dad);
          value = iVar9 + 9;
          iVar3 = 3;
        }
        else {
          send_bits(this,(uint)this->bl_tree[0x12].fc.freq,(uint)this->bl_tree[0x12].dl.dad);
          iVar3 = 7;
        }
      }
      else {
        uVar4 = iVar9 + 0xcU;
        if (uVar7 != uVar6) {
          send_bits(this,(uint)this->bl_tree[uVar7].fc.freq,(uint)this->bl_tree[uVar7].dl.dad);
          uVar4 = iVar9 + 0xbU;
        }
        send_bits(this,(uint)this->bl_tree[0x10].fc.freq,(uint)this->bl_tree[0x10].dl.dad);
        value = uVar4 - 3;
        iVar3 = 2;
      }
      send_bits(this,value,iVar3);
    }
    uVar4 = uVar7 == uVar8 ^ 7;
    if (uVar1 == 0) {
      uVar4 = 0x8a;
    }
    iVar3 = 4 - (uint)(uVar7 == uVar8);
    uVar6 = uVar7;
    if (uVar1 == 0) {
      iVar3 = 3;
    }
  } while( true );
}

Assistant:

void IZDeflate::send_tree (ct_data near *tree, int max_code)
    // ct_data near *tree; /* the tree to be scanned */
    // int max_code;       /* and its largest code of non zero frequency */
{
    int n;                     /* iterates over all tree elements */
    int prevlen = -1;          /* last emitted length */
    int curlen;                /* length of current code */
    int nextlen = tree[0].Len; /* length of next code */
    int count = 0;             /* repeat count of the current code */
    int max_count = 7;         /* max repeat count */
    int min_count = 4;         /* min repeat count */

    /* tree[max_code+1].Len = -1; */  /* guard already set */
    if (nextlen == 0) max_count = 138, min_count = 3;

    for (n = 0; n <= max_code; n++) {
        curlen = nextlen; nextlen = tree[n+1].Len;
        if (++count < max_count && curlen == nextlen) {
            continue;
        } else if (count < min_count) {
            do { send_code(curlen, bl_tree); } while (--count != 0);

        } else if (curlen != 0) {
            if (curlen != prevlen) {
                send_code(curlen, bl_tree); count--;
            }
            Assert(count >= 3 && count <= 6, " 3_6?");
            send_code(REP_3_6, bl_tree); send_bits(count-3, 2);

        } else if (count <= 10) {
            send_code(REPZ_3_10, bl_tree); send_bits(count-3, 3);

        } else {
            send_code(REPZ_11_138, bl_tree); send_bits(count-11, 7);
        }
        count = 0; prevlen = curlen;
        if (nextlen == 0) {
            max_count = 138, min_count = 3;
        } else if (curlen == nextlen) {
            max_count = 6, min_count = 3;
        } else {
            max_count = 7, min_count = 4;
        }
    }
}